

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CountersReader.h
# Opt level: O0

void __thiscall
aeron::concurrent::CountersReader::validateCounterId(CountersReader *this,int32_t counterId)

{
  IllegalArgumentException *this_00;
  char *pcVar1;
  int in_ESI;
  long in_RDI;
  allocator *filename;
  allocator local_109;
  string local_108;
  allocator local_e1;
  string local_e0;
  string local_c0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  int local_c;
  
  if ((-1 < in_ESI) && (in_ESI <= *(int *)(in_RDI + 0x30))) {
    return;
  }
  local_c = in_ESI;
  this_00 = (IllegalArgumentException *)__cxa_allocate_exception(0x48);
  std::__cxx11::to_string(&local_90,local_c);
  std::operator+(&local_70,"counter id ",&local_90);
  std::operator+(&local_50,&local_70," out of range: maxCounterId=");
  std::__cxx11::to_string(&local_c0,*(int *)(in_RDI + 0x30));
  std::operator+(&local_30,&local_50,&local_c0);
  filename = &local_e1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_e0,
             "void aeron::concurrent::CountersReader::validateCounterId(std::int32_t) const",
             filename);
  pcVar1 = util::past_prefix((char *)this_00,(char *)filename);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_108,pcVar1,&local_109);
  util::IllegalArgumentException::IllegalArgumentException
            (this_00,&local_30,&local_e0,&local_108,0xdb);
  __cxa_throw(this_00,&util::IllegalArgumentException::typeinfo,
              util::IllegalArgumentException::~IllegalArgumentException);
}

Assistant:

void validateCounterId(std::int32_t counterId) const
    {
        if (counterId < 0 || counterId > m_maxCounterId)
        {
            throw util::IllegalArgumentException(
                "counter id " + std::to_string(counterId) +
                " out of range: maxCounterId=" + std::to_string(m_maxCounterId),
                SOURCEINFO);
        }
    }